

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

int __thiscall
glcts::BlendEquationSeparateCase::init(BlendEquationSeparateCase *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RAX;
  ModeCase *this_00;
  undefined8 extraout_RAX;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x3c; lVar1 = lVar1 + 4) {
    this_00 = (ModeCase *)operator_new(0x80);
    ModeCase::ModeCase(this_00,(this->super_TestCaseGroup).m_context,
                       *(GLenum *)((long)&s_modes + lVar1));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void init(void)
	{
		// Pump individual modes.
		for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_modes); i++)
			addChild(new ModeCase(m_context, s_modes[i]));
	}